

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::dxt_hc::tile_details>::~vector(vector<crnlib::dxt_hc::tile_details> *this)

{
  vector<crnlib::dxt_hc::tile_details> *this_local;
  
  if (this->m_p != (tile_details *)0x0) {
    scalar_type<crnlib::dxt_hc::tile_details>::destruct_array(this->m_p,this->m_size);
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }